

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

bool __thiscall
slang::ast::InstanceCacheKey::operator==(InstanceCacheKey *this,InstanceCacheKey *other)

{
  element_type pPVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar2;
  DefinitionSymbol *pDVar3;
  DefinitionSymbol *pDVar4;
  char *pcVar5;
  char *pcVar6;
  Type *pTVar7;
  reference ppPVar8;
  InstanceCacheKey *pIVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  long in_RSI;
  char *in_RDI;
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> sVar12;
  value_type *r;
  value_type *l;
  size_t i_1;
  Type *rt;
  Type *lt;
  ParameterSymbolBase *rp;
  ParameterSymbolBase *lp;
  size_t i;
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> rparams;
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> lparams;
  InstanceBodySymbol *in_stack_ffffffffffffff08;
  InstanceCacheKey *other_00;
  ParameterSymbol *in_stack_ffffffffffffff10;
  InstanceCacheKey *local_88;
  Type *in_stack_ffffffffffffff80;
  Type *pTVar13;
  Type *rhs;
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> local_28;
  long local_18;
  
  if (*(long *)(in_RDI + 0x20) == *(long *)(in_RSI + 0x20)) {
    local_18 = in_RSI;
    not_null<const_slang::ast::InstanceSymbol_*>::operator->
              ((not_null<const_slang::ast::InstanceSymbol_*> *)0x1161cf0);
    pDVar3 = InstanceSymbol::getDefinition((InstanceSymbol *)0x1161cf8);
    not_null<const_slang::ast::InstanceSymbol_*>::operator->
              ((not_null<const_slang::ast::InstanceSymbol_*> *)0x1161d0a);
    pDVar4 = InstanceSymbol::getDefinition((InstanceSymbol *)0x1161d12);
    if (pDVar3 == pDVar4) {
      pcVar5 = (char *)std::
                       vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                       ::size((vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                               *)(in_RDI + 8));
      pcVar6 = (char *)std::
                       vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                       ::size((vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                               *)(local_18 + 8));
      if (pcVar5 == pcVar6) {
        not_null<const_slang::ast::InstanceSymbol_*>::operator->
                  ((not_null<const_slang::ast::InstanceSymbol_*> *)0x1161d67);
        local_28 = InstanceBodySymbol::getParameters(in_stack_ffffffffffffff08);
        not_null<const_slang::ast::InstanceSymbol_*>::operator->
                  ((not_null<const_slang::ast::InstanceSymbol_*> *)0x1161d8d);
        sVar12 = InstanceBodySymbol::getParameters(in_stack_ffffffffffffff08);
        pTVar13 = (Type *)0x0;
        while (rhs = pTVar13,
              pTVar7 = (Type *)std::
                               span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>
                               ::size((span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>
                                       *)0x1161dce), pTVar13 < pTVar7) {
          ppPVar8 = std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>
                    ::operator[](&local_28,(size_type)rhs);
          pPVar1 = *ppPVar8;
          std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::
          operator[]((span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> *)
                     &stack0xffffffffffffffc8,(size_type)rhs);
          if (pPVar1->symbol->kind == Parameter) {
            in_stack_ffffffffffffff10 = Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0x1161e45)
            ;
            SourceRange::SourceRange((SourceRange *)in_stack_ffffffffffffff10);
            ParameterSymbol::getValue((ParameterSymbol *)i,(SourceRange)rparams);
            Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0x1161e86);
            SourceRange::SourceRange((SourceRange *)in_stack_ffffffffffffff10);
            ParameterSymbol::getValue((ParameterSymbol *)i,(SourceRange)rparams);
            bVar2 = slang::operator==((ConstantValue *)in_stack_ffffffffffffff10,
                                      (ConstantValue *)in_stack_ffffffffffffff08);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              return false;
            }
          }
          else {
            Symbol::as<slang::ast::TypeParameterSymbol>((Symbol *)0x1161ee6);
            DeclaredType::getType((DeclaredType *)in_stack_ffffffffffffff80);
            Symbol::as<slang::ast::TypeParameterSymbol>((Symbol *)0x1161f0a);
            in_stack_ffffffffffffff80 =
                 DeclaredType::getType((DeclaredType *)in_stack_ffffffffffffff80);
            bVar2 = Type::isMatching((Type *)sVar12._M_ptr,rhs);
            if (!bVar2) {
              return false;
            }
          }
          pTVar13 = (Type *)((long)&(rhs->super_Symbol).kind + 1);
        }
        local_88 = (InstanceCacheKey *)0x0;
        while( true ) {
          other_00 = local_88;
          pIVar9 = (InstanceCacheKey *)
                   std::
                   vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                   ::size((vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                           *)(in_RDI + 8));
          if (pIVar9 <= other_00) {
            return true;
          }
          pvVar10 = std::
                    vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                    ::operator[]((vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                                  *)(in_RDI + 8),(size_type)local_88);
          pvVar11 = std::
                    vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                    ::operator[]((vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                                  *)(local_18 + 8),(size_type)local_88);
          bVar2 = operator!=((InstanceCacheKey *)in_stack_ffffffffffffff10,other_00);
          if (bVar2) break;
          if (((pvVar10->second != (ModportSymbol *)0x0) !=
               (pvVar11->second != (ModportSymbol *)0x0)) ||
             ((pvVar10->second != (ModportSymbol *)0x0 &&
              (__x._M_str = in_RDI, __x._M_len = (size_t)pDVar3, __y._M_str = pcVar5,
              __y._M_len = (size_t)pTVar13, bVar2 = std::operator==(__x,__y),
              ((bVar2 ^ 0xffU) & 1) != 0)))) {
            return false;
          }
          local_88 = (InstanceCacheKey *)((long)&(local_88->symbol).ptr + 1);
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool InstanceCacheKey::operator==(const InstanceCacheKey& other) const {
    if (savedHash != other.savedHash ||
        &symbol->getDefinition() != &other.symbol->getDefinition() ||
        ifaceKeys.size() != other.ifaceKeys.size()) {
        return false;
    }

    auto lparams = symbol->body.getParameters();
    auto rparams = other.symbol->body.getParameters();
    SLANG_ASSERT(lparams.size() == rparams.size());

    for (size_t i = 0; i < lparams.size(); i++) {
        auto lp = lparams[i];
        auto rp = rparams[i];
        SLANG_ASSERT(lp->symbol.kind == rp->symbol.kind);

        if (lp->symbol.kind == SymbolKind::Parameter) {
            if (lp->symbol.as<ParameterSymbol>().getValue() !=
                rp->symbol.as<ParameterSymbol>().getValue()) {
                return false;
            }
        }
        else {
            auto& lt = lp->symbol.as<TypeParameterSymbol>().targetType.getType();
            auto& rt = rp->symbol.as<TypeParameterSymbol>().targetType.getType();
            if (!lt.isMatching(rt))
                return false;
        }
    }

    for (size_t i = 0; i < ifaceKeys.size(); i++) {
        auto& l = ifaceKeys[i];
        auto& r = other.ifaceKeys[i];
        if (l.first != r.first)
            return false;

        if (bool(l.second) != bool(r.second) || (l.second && l.second->name != r.second->name))
            return false;
    }

    return true;
}